

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minigzip.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  gzFile pgVar8;
  FILE *in;
  bool bVar9;
  long lVar10;
  long lVar11;
  char *__s1;
  bool bVar12;
  char outmode [20];
  
  builtin_strncpy(outmode,"wb6 ",5);
  pcVar1 = *argv;
  prog = pcVar1;
  pcVar7 = strrchr(pcVar1,0x2f);
  __s1 = pcVar7 + 1;
  if (pcVar7 == (char *)0x0) {
    __s1 = pcVar1;
  }
  iVar5 = strcmp(__s1,"gunzip");
  if (iVar5 == 0) {
    bVar4 = false;
    bVar12 = true;
  }
  else {
    iVar5 = strcmp(__s1,"zcat");
    bVar12 = iVar5 == 0;
    bVar4 = bVar12;
  }
  bVar9 = true;
  lVar2 = 1;
  lVar3 = -8;
  lVar10 = lVar2;
  lVar11 = lVar3;
  iVar5 = argc;
LAB_0010169e:
  do {
    while( true ) {
      while( true ) {
        iVar6 = (int)lVar10;
        if ((argc < 2) || (pcVar1 = argv[lVar10], *pcVar1 != '-')) goto LAB_0010175f;
        if ((pcVar1[1] != 'c') || (pcVar1[2] != '\0')) break;
        argv = (char **)((long)argv - lVar11);
        argc = iVar5 - iVar6;
        bVar4 = true;
        lVar10 = lVar2;
        lVar11 = lVar3;
        iVar5 = argc;
      }
      if ((pcVar1[1] != 'd') || (pcVar1[2] != '\0')) break;
      argv = (char **)((long)argv - lVar11);
      argc = iVar5 - iVar6;
      bVar12 = true;
      lVar10 = lVar2;
      lVar11 = lVar3;
      iVar5 = argc;
    }
    if ((pcVar1[1] == 'f') && (pcVar1[2] == '\0')) {
      outmode[3] = 'f';
    }
    else if ((pcVar1[1] == 'h') && (pcVar1[2] == '\0')) {
      outmode[3] = 'h';
    }
    else {
      if ((pcVar1[1] != 'r') || (pcVar1[2] != '\0')) {
        if ((8 < (byte)(pcVar1[1] - 0x31U)) || (pcVar1[2] != '\0')) break;
        outmode[2] = pcVar1[1];
        argc = argc + -1;
        lVar10 = lVar10 + 1;
        lVar11 = lVar11 + -8;
        goto LAB_0010169e;
      }
      outmode[3] = 'R';
    }
    argv = (char **)((long)argv - lVar11);
    argc = iVar5 - iVar6;
    bVar9 = false;
    lVar10 = lVar2;
    lVar11 = lVar3;
    iVar5 = argc;
  } while( true );
LAB_0010175f:
  if (bVar9) {
    outmode._0_4_ = outmode._0_4_ & 0xffffff;
  }
  if (iVar5 == iVar6) {
    if (bVar12) {
      iVar5 = fileno(_stdin);
      pgVar8 = (gzFile)gzdopen(iVar5,"rb");
      if (pgVar8 == (gzFile)0x0) {
        error("can\'t gzdopen stdin");
      }
      gz_uncompress(pgVar8,(FILE *)_stdout);
    }
    else {
      iVar5 = fileno(_stdout);
      pgVar8 = (gzFile)gzdopen(iVar5,outmode);
      if (pgVar8 == (gzFile)0x0) {
LAB_001018e7:
        error("can\'t gzdopen stdout");
      }
      gz_compress((FILE *)_stdin,pgVar8);
    }
  }
  else {
    do {
      pcVar1 = argv[lVar10];
      if (bVar12) {
        if (bVar4) {
          pgVar8 = (gzFile)gzopen(pcVar1,"rb");
          if (pgVar8 == (gzFile)0x0) {
            fprintf(_stderr,"%s: can\'t gzopen %s\n",prog,argv[lVar10]);
          }
          else {
            gz_uncompress(pgVar8,(FILE *)_stdout);
          }
        }
        else {
          file_uncompress(pcVar1);
        }
      }
      else if (bVar4) {
        in = fopen(pcVar1,"rb");
        if (in == (FILE *)0x0) {
          perror(argv[lVar10]);
        }
        else {
          iVar6 = fileno(_stdout);
          pgVar8 = (gzFile)gzdopen(iVar6,outmode);
          if (pgVar8 == (gzFile)0x0) goto LAB_001018e7;
          gz_compress((FILE *)in,pgVar8);
        }
      }
      else {
        file_compress(pcVar1,outmode);
      }
      lVar10 = lVar10 + 1;
    } while (iVar5 != (int)lVar10);
  }
  return 0;
}

Assistant:

int main(argc, argv)
    int argc;
    char *argv[];
{
    int copyout = 0;
    int uncompr = 0;
    gzFile file;
    char *bname, outmode[20];

#if !defined(NO_snprintf) && !defined(NO_vsnprintf)
    snprintf(outmode, sizeof(outmode), "%s", "wb6 ");
#else
    strcpy(outmode, "wb6 ");
#endif

    prog = argv[0];
    bname = strrchr(argv[0], '/');
    if (bname)
      bname++;
    else
      bname = argv[0];
    argc--, argv++;

    if (!strcmp(bname, "gunzip"))
      uncompr = 1;
    else if (!strcmp(bname, "zcat"))
      copyout = uncompr = 1;

    while (argc > 0) {
      if (strcmp(*argv, "-c") == 0)
        copyout = 1;
      else if (strcmp(*argv, "-d") == 0)
        uncompr = 1;
      else if (strcmp(*argv, "-f") == 0)
        outmode[3] = 'f';
      else if (strcmp(*argv, "-h") == 0)
        outmode[3] = 'h';
      else if (strcmp(*argv, "-r") == 0)
        outmode[3] = 'R';
      else if ((*argv)[0] == '-' && (*argv)[1] >= '1' && (*argv)[1] <= '9' &&
               (*argv)[2] == 0)
        outmode[2] = (*argv)[1];
      else
        break;
      argc--, argv++;
    }
    if (outmode[3] == ' ')
        outmode[3] = 0;
    if (argc == 0) {
        SET_BINARY_MODE(stdin);
        SET_BINARY_MODE(stdout);
        if (uncompr) {
            file = gzdopen(fileno(stdin), "rb");
            if (file == NULL) error("can't gzdopen stdin");
            gz_uncompress(file, stdout);
        } else {
            file = gzdopen(fileno(stdout), outmode);
            if (file == NULL) error("can't gzdopen stdout");
            gz_compress(stdin, file);
        }
    } else {
        if (copyout) {
            SET_BINARY_MODE(stdout);
        }
        do {
            if (uncompr) {
                if (copyout) {
                    file = gzopen(*argv, "rb");
                    if (file == NULL)
                        fprintf(stderr, "%s: can't gzopen %s\n", prog, *argv);
                    else
                        gz_uncompress(file, stdout);
                } else {
                    file_uncompress(*argv);
                }
            } else {
                if (copyout) {
                    FILE * in = fopen(*argv, "rb");

                    if (in == NULL) {
                        perror(*argv);
                    } else {
                        file = gzdopen(fileno(stdout), outmode);
                        if (file == NULL) error("can't gzdopen stdout");

                        gz_compress(in, file);
                    }

                } else {
                    file_compress(*argv, outmode);
                }
            }
        } while (argv++, --argc);
    }
    return 0;
}